

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5TermsetFree(Fts5Termset *p)

{
  Fts5TermsetEntry *pFVar1;
  Fts5TermsetEntry *pDel;
  Fts5TermsetEntry *pEntry;
  u32 i;
  Fts5Termset *p_local;
  
  if (p != (Fts5Termset *)0x0) {
    for (pEntry._4_4_ = 0; pEntry._4_4_ < 0x200; pEntry._4_4_ = pEntry._4_4_ + 1) {
      pDel = p->apHash[pEntry._4_4_];
      while (pDel != (Fts5TermsetEntry *)0x0) {
        pFVar1 = pDel->pNext;
        sqlite3_free(pDel);
        pDel = pFVar1;
      }
    }
    sqlite3_free(p);
  }
  return;
}

Assistant:

static void sqlite3Fts5TermsetFree(Fts5Termset *p){
  if( p ){
    u32 i;
    for(i=0; i<ArraySize(p->apHash); i++){
      Fts5TermsetEntry *pEntry = p->apHash[i];
      while( pEntry ){
        Fts5TermsetEntry *pDel = pEntry;
        pEntry = pEntry->pNext;
        sqlite3_free(pDel);
      }
    }
    sqlite3_free(p);
  }
}